

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined8 uVar17;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_6;
  float *p0_6;
  __m128 _tmp1_3;
  __m128 _tmp0_3;
  __m128 _r1_4;
  __m128 _r0_4;
  __m256 _r1_3;
  __m256 _r0_3;
  int kk_5;
  float *p1_3;
  float *p0_5;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _r3_2;
  __m128 _r2_2;
  __m128 _r1_2;
  __m128 _r0_2;
  __m256 _r3_1;
  __m256 _r2_1;
  __m256 _r1_1;
  __m256 _r0_1;
  int kk_4;
  float *p3_1;
  float *p2_1;
  float *p1_2;
  float *p0_4;
  int kk_3;
  float *p0_3;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int kk_2;
  float *p7;
  float *p6;
  float *p5;
  float *p4;
  float *p3;
  float *p2;
  float *p1_1;
  float *p0_2;
  int kk_1;
  float *p1;
  float *p0_1;
  int kk;
  float *p0;
  int ii;
  float *pp;
  int A_hstep;
  int elempack;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  int local_12f0;
  int local_12ec;
  undefined1 (*local_12e8) [32];
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  int local_1254;
  undefined1 (*local_1250) [32];
  undefined1 (*local_1248) [32];
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  int local_1134;
  undefined1 (*local_1130) [32];
  undefined1 (*local_1128) [32];
  undefined1 (*local_1120) [32];
  undefined1 (*local_1118) [32];
  int local_110c;
  undefined1 (*local_1108) [16];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  int local_fec;
  undefined1 (*local_fe8) [32];
  undefined1 (*local_fe0) [32];
  undefined1 (*local_fd8) [32];
  undefined1 (*local_fd0) [32];
  undefined1 (*local_fc8) [32];
  undefined1 (*local_fc0) [32];
  undefined1 (*local_fb8) [32];
  undefined1 (*local_fb0) [32];
  int local_fa4;
  undefined1 (*local_fa0) [16];
  undefined8 *local_f98;
  int local_f8c;
  undefined1 (*local_f88) [32];
  int local_f7c;
  undefined1 (*local_f78) [32];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_12f0 = (int)in_RDI[8];
  }
  else {
    local_12f0 = *(int *)((long)in_RDI + 0x2c);
  }
  local_f78 = (undefined1 (*) [32])*in_RSI;
  for (local_f7c = 0; local_f7c + 7 < in_ECX; local_f7c = local_f7c + 8) {
    if (iVar1 == 8) {
      local_f88 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)(in_R8D << 3) * 4
                  );
      for (local_f8c = 0; local_f8c < in_R9D; local_f8c = local_f8c + 1) {
        *local_f78 = *local_f88;
        local_f78 = local_f78 + 1;
        local_f88 = local_f88 + 1;
      }
    }
    if (iVar1 == 4) {
      local_f98 = (undefined8 *)
                  (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)(in_R8D << 2) * 4
                  );
      local_fa0 = (undefined1 (*) [16])
                  (*in_RDI + (long)((in_EDX + local_f7c + 4) * local_12f0) * 4 +
                  (long)(in_R8D << 2) * 4);
      for (local_fa4 = 0; local_fa4 < in_R9D; local_fa4 = local_fa4 + 1) {
        uVar17 = local_f98[1];
        *(undefined8 *)*local_f78 = *local_f98;
        *(undefined8 *)(*local_f78 + 8) = uVar17;
        *(undefined1 (*) [16])(*local_f78 + 0x10) = *local_fa0;
        local_f78 = local_f78 + 1;
        local_f98 = local_f98 + 2;
        local_fa0 = local_fa0 + 1;
      }
    }
    if (iVar1 == 1) {
      local_fb0 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fb8 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 1) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fc0 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 2) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fc8 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 3) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fd0 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 4) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fd8 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 5) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fe0 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 6) * local_12f0) * 4 + (long)in_R8D * 4);
      local_fe8 = (undefined1 (*) [32])
                  (*in_RDI + (long)((in_EDX + local_f7c + 7) * local_12f0) * 4 + (long)in_R8D * 4);
      for (local_fec = 0; local_fec + 7 < in_R9D; local_fec = local_fec + 8) {
        auVar13 = vunpcklps_avx(*local_fb0,*local_fb8);
        auVar4 = vunpckhps_avx(*local_fb0,*local_fb8);
        auVar14 = vunpcklps_avx(*local_fc0,*local_fc8);
        auVar5 = vunpckhps_avx(*local_fc0,*local_fc8);
        auVar15 = vunpcklps_avx(*local_fd0,*local_fd8);
        auVar6 = vunpckhps_avx(*local_fd0,*local_fd8);
        auVar16 = vunpcklps_avx(*local_fe0,*local_fe8);
        auVar7 = vunpckhps_avx(*local_fe0,*local_fe8);
        auVar9 = vunpcklpd_avx(auVar13,auVar14);
        auVar13 = vunpckhpd_avx(auVar13,auVar14);
        auVar14 = vunpcklpd_avx(auVar4,auVar5);
        auVar4 = vunpckhpd_avx(auVar4,auVar5);
        auVar10 = vunpcklpd_avx(auVar15,auVar16);
        auVar5 = vunpckhpd_avx(auVar15,auVar16);
        auVar15 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        local_dc0 = auVar9._0_8_;
        uStack_db8 = auVar9._8_8_;
        local_e40 = auVar10._0_8_;
        uStack_e38 = auVar10._8_8_;
        local_de0 = auVar13._0_8_;
        uStack_dd8 = auVar13._8_8_;
        local_e60 = auVar5._0_8_;
        uStack_e58 = auVar5._8_8_;
        local_e00 = auVar14._0_8_;
        uStack_df8 = auVar14._8_8_;
        local_e80 = auVar15._0_8_;
        uStack_e78 = auVar15._8_8_;
        local_e20 = auVar4._0_8_;
        uStack_e18 = auVar4._8_8_;
        local_ea0 = auVar6._0_8_;
        uStack_e98 = auVar6._8_8_;
        auVar7 = vperm2f128_avx(auVar9,auVar10,0x31);
        uStack_1088 = auVar7._24_8_;
        uStack_1090 = auVar7._16_8_;
        uStack_1098 = auVar7._8_8_;
        local_10a0 = auVar7._0_8_;
        auVar13 = vperm2f128_avx(auVar13,auVar5,0x31);
        uStack_10a8 = auVar13._24_8_;
        uStack_10b0 = auVar13._16_8_;
        uStack_10b8 = auVar13._8_8_;
        local_10c0 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar14,auVar15,0x31);
        uStack_10c8 = auVar13._24_8_;
        uStack_10d0 = auVar13._16_8_;
        uStack_10d8 = auVar13._8_8_;
        local_10e0 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar4,auVar6,0x31);
        *(undefined8 *)*local_f78 = local_dc0;
        *(undefined8 *)(*local_f78 + 8) = uStack_db8;
        *(undefined8 *)(*local_f78 + 0x10) = local_e40;
        *(undefined8 *)(*local_f78 + 0x18) = uStack_e38;
        *(undefined8 *)local_f78[1] = local_de0;
        *(undefined8 *)(local_f78[1] + 8) = uStack_dd8;
        *(undefined8 *)(local_f78[1] + 0x10) = local_e60;
        *(undefined8 *)(local_f78[1] + 0x18) = uStack_e58;
        *(undefined8 *)local_f78[2] = local_e00;
        *(undefined8 *)(local_f78[2] + 8) = uStack_df8;
        *(undefined8 *)(local_f78[2] + 0x10) = local_e80;
        *(undefined8 *)(local_f78[2] + 0x18) = uStack_e78;
        *(undefined8 *)local_f78[3] = local_e20;
        *(undefined8 *)(local_f78[3] + 8) = uStack_e18;
        *(undefined8 *)(local_f78[3] + 0x10) = local_ea0;
        *(undefined8 *)(local_f78[3] + 0x18) = uStack_e98;
        *(undefined8 *)local_f78[4] = local_10a0;
        *(undefined8 *)(local_f78[4] + 8) = uStack_1098;
        *(undefined8 *)(local_f78[4] + 0x10) = uStack_1090;
        *(undefined8 *)(local_f78[4] + 0x18) = uStack_1088;
        *(undefined8 *)local_f78[5] = local_10c0;
        *(undefined8 *)(local_f78[5] + 8) = uStack_10b8;
        *(undefined8 *)(local_f78[5] + 0x10) = uStack_10b0;
        *(undefined8 *)(local_f78[5] + 0x18) = uStack_10a8;
        *(undefined8 *)local_f78[6] = local_10e0;
        *(undefined8 *)(local_f78[6] + 8) = uStack_10d8;
        *(undefined8 *)(local_f78[6] + 0x10) = uStack_10d0;
        *(undefined8 *)(local_f78[6] + 0x18) = uStack_10c8;
        local_f78[7] = auVar13;
        local_f78 = local_f78 + 8;
        local_fb0 = local_fb0 + 1;
        local_fb8 = local_fb8 + 1;
        local_fc0 = local_fc0 + 1;
        local_fc8 = local_fc8 + 1;
        local_fd0 = local_fd0 + 1;
        local_fd8 = local_fd8 + 1;
        local_fe0 = local_fe0 + 1;
        local_fe8 = local_fe8 + 1;
      }
      for (; local_fec < in_R9D; local_fec = local_fec + 1) {
        *(undefined4 *)*local_f78 = *(undefined4 *)*local_fb0;
        *(undefined4 *)(*local_f78 + 4) = *(undefined4 *)*local_fb8;
        *(undefined4 *)(*local_f78 + 8) = *(undefined4 *)*local_fc0;
        *(undefined4 *)(*local_f78 + 0xc) = *(undefined4 *)*local_fc8;
        *(undefined4 *)(*local_f78 + 0x10) = *(undefined4 *)*local_fd0;
        *(undefined4 *)(*local_f78 + 0x14) = *(undefined4 *)*local_fd8;
        *(undefined4 *)(*local_f78 + 0x18) = *(undefined4 *)*local_fe0;
        *(undefined4 *)(*local_f78 + 0x1c) = *(undefined4 *)*local_fe8;
        local_f78 = local_f78 + 1;
        local_fb0 = (undefined1 (*) [32])(*local_fb0 + 4);
        local_fb8 = (undefined1 (*) [32])(*local_fb8 + 4);
        local_fc0 = (undefined1 (*) [32])(*local_fc0 + 4);
        local_fc8 = (undefined1 (*) [32])(*local_fc8 + 4);
        local_fd0 = (undefined1 (*) [32])(*local_fd0 + 4);
        local_fd8 = (undefined1 (*) [32])(*local_fd8 + 4);
        local_fe0 = (undefined1 (*) [32])(*local_fe0 + 4);
        local_fe8 = (undefined1 (*) [32])(*local_fe8 + 4);
      }
    }
  }
  for (; local_f7c + 3 < in_ECX; local_f7c = local_f7c + 4) {
    if (iVar1 == 4) {
      local_1108 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_110c = 0; local_110c < in_R9D; local_110c = local_110c + 1) {
        *(undefined1 (*) [16])*local_f78 = *local_1108;
        local_f78 = (undefined1 (*) [32])(*local_f78 + 0x10);
        local_1108 = local_1108 + 1;
      }
    }
    if (iVar1 == 1) {
      local_1118 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)in_R8D * 4);
      local_1120 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_f7c + 1) * local_12f0) * 4 + (long)in_R8D * 4);
      local_1128 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_f7c + 2) * local_12f0) * 4 + (long)in_R8D * 4);
      local_1130 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_f7c + 3) * local_12f0) * 4 + (long)in_R8D * 4);
      for (local_1134 = 0; local_1134 + 7 < in_R9D; local_1134 = local_1134 + 8) {
        auVar13 = vunpcklps_avx(*local_1118,*local_1120);
        auVar4 = vunpckhps_avx(*local_1118,*local_1120);
        auVar7 = vunpcklps_avx(*local_1128,*local_1130);
        auVar5 = vunpckhps_avx(*local_1128,*local_1130);
        auVar6 = vunpcklpd_avx(auVar13,auVar7);
        auVar13 = vunpckhpd_avx(auVar13,auVar7);
        auVar7 = vunpcklpd_avx(auVar4,auVar5);
        auVar4 = vunpckhpd_avx(auVar4,auVar5);
        local_5e0 = auVar6._0_8_;
        uStack_5d8 = auVar6._8_8_;
        local_600 = auVar13._0_8_;
        uStack_5f8 = auVar13._8_8_;
        local_620 = auVar7._0_8_;
        uStack_618 = auVar7._8_8_;
        local_640 = auVar4._0_8_;
        uStack_638 = auVar4._8_8_;
        auVar13 = vperm2f128_avx(auVar6,auVar13,0x31);
        uStack_1188 = auVar13._24_8_;
        uStack_1190 = auVar13._16_8_;
        uStack_1198 = auVar13._8_8_;
        local_11a0 = auVar13._0_8_;
        auVar13 = vperm2f128_avx(auVar7,auVar4,0x31);
        *(undefined8 *)*local_f78 = local_5e0;
        *(undefined8 *)(*local_f78 + 8) = uStack_5d8;
        *(undefined8 *)(*local_f78 + 0x10) = local_600;
        *(undefined8 *)(*local_f78 + 0x18) = uStack_5f8;
        *(undefined8 *)local_f78[1] = local_620;
        *(undefined8 *)(local_f78[1] + 8) = uStack_618;
        *(undefined8 *)(local_f78[1] + 0x10) = local_640;
        *(undefined8 *)(local_f78[1] + 0x18) = uStack_638;
        *(undefined8 *)local_f78[2] = local_11a0;
        *(undefined8 *)(local_f78[2] + 8) = uStack_1198;
        *(undefined8 *)(local_f78[2] + 0x10) = uStack_1190;
        *(undefined8 *)(local_f78[2] + 0x18) = uStack_1188;
        local_f78[3] = auVar13;
        local_f78 = local_f78 + 4;
        local_1118 = local_1118 + 1;
        local_1120 = local_1120 + 1;
        local_1128 = local_1128 + 1;
        local_1130 = local_1130 + 1;
      }
      for (; local_1134 + 3 < in_R9D; local_1134 = local_1134 + 4) {
        auVar11 = vunpcklps_avx(*(undefined1 (*) [16])*local_1118,*(undefined1 (*) [16])*local_1120)
        ;
        auVar12 = vunpcklps_avx(*(undefined1 (*) [16])*local_1128,*(undefined1 (*) [16])*local_1130)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_1118,*(undefined1 (*) [16])*local_1120);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_1128,*(undefined1 (*) [16])*local_1130);
        auVar8 = vunpcklpd_avx(auVar11,auVar12);
        auVar11 = vunpckhpd_avx(auVar11,auVar12);
        auVar12 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_11d0 = auVar8._0_8_;
        uStack_11c8 = auVar8._8_8_;
        *(undefined8 *)*local_f78 = local_11d0;
        *(undefined8 *)(*local_f78 + 8) = uStack_11c8;
        local_11e0 = auVar11._0_8_;
        uStack_11d8 = auVar11._8_8_;
        *(undefined8 *)(*local_f78 + 0x10) = local_11e0;
        *(undefined8 *)(*local_f78 + 0x18) = uStack_11d8;
        local_11f0 = auVar12._0_8_;
        uStack_11e8 = auVar12._8_8_;
        *(undefined8 *)local_f78[1] = local_11f0;
        *(undefined8 *)(local_f78[1] + 8) = uStack_11e8;
        *(undefined1 (*) [16])(local_f78[1] + 0x10) = auVar2;
        local_f78 = local_f78 + 2;
        local_1118 = (undefined1 (*) [32])(*local_1118 + 0x10);
        local_1120 = (undefined1 (*) [32])(*local_1120 + 0x10);
        local_1128 = (undefined1 (*) [32])(*local_1128 + 0x10);
        local_1130 = (undefined1 (*) [32])(*local_1130 + 0x10);
      }
      for (; local_1134 < in_R9D; local_1134 = local_1134 + 1) {
        *(undefined4 *)*local_f78 = *(undefined4 *)*local_1118;
        *(undefined4 *)(*local_f78 + 4) = *(undefined4 *)*local_1120;
        *(undefined4 *)(*local_f78 + 8) = *(undefined4 *)*local_1128;
        *(undefined4 *)(*local_f78 + 0xc) = *(undefined4 *)*local_1130;
        local_f78 = (undefined1 (*) [32])(*local_f78 + 0x10);
        local_1118 = (undefined1 (*) [32])(*local_1118 + 4);
        local_1120 = (undefined1 (*) [32])(*local_1120 + 4);
        local_1128 = (undefined1 (*) [32])(*local_1128 + 4);
        local_1130 = (undefined1 (*) [32])(*local_1130 + 4);
      }
    }
  }
  for (; local_f7c + 1 < in_ECX; local_f7c = local_f7c + 2) {
    local_1248 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)in_R8D * 4);
    local_1250 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_f7c + 1) * local_12f0) * 4 + (long)in_R8D * 4);
    for (local_1254 = 0; local_1254 + 7 < in_R9D; local_1254 = local_1254 + 8) {
      auVar4 = vunpcklps_avx(*local_1248,*local_1250);
      auVar13 = vunpckhps_avx(*local_1248,*local_1250);
      local_4c0 = auVar4._0_8_;
      uStack_4b8 = auVar4._8_8_;
      local_4e0 = auVar13._0_8_;
      uStack_4d8 = auVar13._8_8_;
      auVar13 = vperm2f128_avx(auVar4,auVar13,0x31);
      *(undefined8 *)*local_f78 = local_4c0;
      *(undefined8 *)(*local_f78 + 8) = uStack_4b8;
      *(undefined8 *)(*local_f78 + 0x10) = local_4e0;
      *(undefined8 *)(*local_f78 + 0x18) = uStack_4d8;
      local_f78[1] = auVar13;
      local_f78 = local_f78 + 2;
      local_1248 = local_1248 + 1;
      local_1250 = local_1250 + 1;
    }
    for (; local_1254 + 3 < in_R9D; local_1254 = local_1254 + 4) {
      auVar2 = vunpcklps_avx(*(undefined1 (*) [16])*local_1248,*(undefined1 (*) [16])*local_1250);
      auVar11 = vunpckhps_avx(*(undefined1 (*) [16])*local_1248,*(undefined1 (*) [16])*local_1250);
      local_12d0 = auVar2._0_8_;
      uStack_12c8 = auVar2._8_8_;
      *(undefined8 *)*local_f78 = local_12d0;
      *(undefined8 *)(*local_f78 + 8) = uStack_12c8;
      *(undefined1 (*) [16])(*local_f78 + 0x10) = auVar11;
      local_f78 = local_f78 + 1;
      local_1248 = (undefined1 (*) [32])(*local_1248 + 0x10);
      local_1250 = (undefined1 (*) [32])(*local_1250 + 0x10);
    }
    for (; local_1254 < in_R9D; local_1254 = local_1254 + 1) {
      *(undefined4 *)*local_f78 = *(undefined4 *)*local_1248;
      *(undefined4 *)(*local_f78 + 4) = *(undefined4 *)*local_1250;
      local_f78 = (undefined1 (*) [32])(*local_f78 + 8);
      local_1248 = (undefined1 (*) [32])(*local_1248 + 4);
      local_1250 = (undefined1 (*) [32])(*local_1250 + 4);
    }
  }
  for (; local_f7c < in_ECX; local_f7c = local_f7c + 1) {
    local_12e8 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_f7c) * local_12f0) * 4 + (long)in_R8D * 4);
    for (local_12ec = 0; local_12ec + 7 < in_R9D; local_12ec = local_12ec + 8) {
      *local_f78 = *local_12e8;
      local_f78 = local_f78 + 1;
      local_12e8 = local_12e8 + 1;
    }
    for (; local_12ec + 3 < in_R9D; local_12ec = local_12ec + 4) {
      *(undefined1 (*) [16])*local_f78 = *(undefined1 (*) [16])*local_12e8;
      local_f78 = (undefined1 (*) [32])(*local_f78 + 0x10);
      local_12e8 = (undefined1 (*) [32])(*local_12e8 + 0x10);
    }
    for (; local_12ec < in_R9D; local_12ec = local_12ec + 1) {
      *(undefined4 *)*local_f78 = *(undefined4 *)*local_12e8;
      local_f78 = (undefined1 (*) [32])(*local_f78 + 4);
      local_12e8 = (undefined1 (*) [32])(*local_12e8 + 4);
    }
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}